

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdb_functional_test.cc
# Opt level: O2

void custom_seqnum_test(bool multi_kv)

{
  ulong uVar1;
  fdb_kvs_handle **ppfVar2;
  void *pvVar3;
  fdb_doc *pfVar4;
  void *pvVar5;
  fdb_doc *pfVar6;
  fdb_status fVar7;
  int iVar8;
  size_t sVar9;
  size_t sVar10;
  ulong uVar11;
  char *pcVar12;
  fdb_doc **doc;
  uint uVar13;
  ulong uVar14;
  ulong uVar15;
  undefined7 in_register_00000039;
  long lVar16;
  long lStackY_460;
  fdb_doc *rdoc;
  fdb_file_handle *dbfile;
  int local_430;
  int local_42c;
  fdb_iterator *iterator;
  fdb_kvs_handle *apfStack_420 [6];
  fdb_kvs_config kvs_config;
  timeval __test_begin;
  fdb_doc *local_3c8 [10];
  char bodybuf [256];
  char keybuf [256];
  fdb_doc real_doc;
  fdb_config fconfig;
  
  gettimeofday((timeval *)&__test_begin,(__timezone_ptr_t)0x0);
  memleak_start();
  rdoc = &real_doc;
  real_doc.seqnum = 0;
  real_doc.deleted = false;
  real_doc._73_3_ = 0;
  real_doc.flags = 0;
  real_doc.keylen = 0;
  real_doc.metalen = 0;
  real_doc.bodylen = 0;
  real_doc.size_ondisk = 0;
  real_doc.offset = 0;
  real_doc.meta = (void *)0x0;
  real_doc.key = keybuf;
  real_doc.body = bodybuf;
  system("rm -rf  dummy* > errorlog.txt");
  fdb_get_default_config();
  fdb_get_default_kvs_config();
  fconfig.buffercache_size = 0;
  fconfig.wal_threshold = 0x400;
  fconfig.flags = 1;
  fconfig.seqtree_opt = '\x01';
  fconfig.compaction_threshold = '\0';
  fconfig.multi_kv_instances = multi_kv;
  fdb_open(&dbfile,"./dummy1",&fconfig);
  local_430 = (int)CONCAT71(in_register_00000039,multi_kv);
  if (local_430 == 0) {
    fVar7 = fdb_kvs_open_default(dbfile,apfStack_420 + 1,&kvs_config);
    if (fVar7 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
              ,0xb45);
      custom_seqnum_test(bool)::__test_pass = 1;
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                    ,0xb45,"void custom_seqnum_test(bool)");
    }
    fVar7 = fdb_set_log_callback(apfStack_420[1],logCallbackFunc,"custom_seqnum_test");
    if (fVar7 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
              ,0xb48);
      custom_seqnum_test(bool)::__test_pass = 1;
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                    ,0xb48,"void custom_seqnum_test(bool)");
    }
    lStackY_460 = 1;
  }
  else {
    for (uVar13 = 3; -1 < (int)uVar13; uVar13 = uVar13 - 1) {
      sprintf((char *)&iterator,"kv%d",(ulong)uVar13);
      fVar7 = fdb_kvs_open(dbfile,apfStack_420 + (ulong)uVar13 + 1,(char *)&iterator,&kvs_config);
      if (fVar7 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                ,0xb3d);
        custom_seqnum_test(bool)::__test_pass = 1;
        __assert_fail("status == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                      ,0xb3d,"void custom_seqnum_test(bool)");
      }
      fVar7 = fdb_set_log_callback
                        (apfStack_420[(ulong)uVar13 + 1],logCallbackFunc,"custom_seqnum_test");
      if (fVar7 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                ,0xb40);
        custom_seqnum_test(bool)::__test_pass = 1;
        __assert_fail("status == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                      ,0xb40,"void custom_seqnum_test(bool)");
      }
    }
    lStackY_460 = 4;
  }
  for (uVar14 = 0; uVar14 != 5; uVar14 = uVar14 + 1) {
    sprintf(keybuf,"key%d",uVar14 & 0xffffffff);
    sprintf(bodybuf,"body%d",uVar14 & 0xffffffff);
    sVar9 = strlen(keybuf);
    sVar10 = strlen(bodybuf);
    fdb_doc_create(local_3c8 + uVar14,keybuf,sVar9 + 1,(void *)0x0,0,bodybuf,sVar10 + 1);
    lVar16 = lStackY_460;
    while (0 < lVar16) {
      ppfVar2 = apfStack_420 + lVar16;
      lVar16 = lVar16 + -1;
      fVar7 = fdb_set(*ppfVar2,local_3c8[uVar14]);
      if (fVar7 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                ,0xb52);
        custom_seqnum_test(bool)::__test_pass = 1;
        __assert_fail("status == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                      ,0xb52,"void custom_seqnum_test(bool)");
      }
    }
  }
  for (uVar14 = 5; uVar14 != 10; uVar14 = uVar14 + 1) {
    sprintf(keybuf,"key%d",uVar14 & 0xffffffff);
    sprintf(bodybuf,"body%d",uVar14 & 0xffffffff);
    doc = local_3c8 + uVar14;
    sVar9 = strlen(keybuf);
    sVar10 = strlen(bodybuf);
    fdb_doc_create(doc,keybuf,sVar9 + 1,(void *)0x0,0,bodybuf,sVar10 + 1);
    lVar16 = lStackY_460;
    while (0 < lVar16) {
      fdb_doc_set_seqnum(*doc,uVar14 * 2 + 2);
      fVar7 = fdb_set(apfStack_420[lVar16],*doc);
      lVar16 = lVar16 + -1;
      if (fVar7 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                ,0xb5e);
        custom_seqnum_test(bool)::__test_pass = 1;
        __assert_fail("status == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                      ,0xb5e,"void custom_seqnum_test(bool)");
      }
    }
  }
  uVar11 = (ulong)((int)lStackY_460 - 1);
  uVar14 = uVar11;
  do {
    if ((int)uVar14 < 0) {
      fdb_compact(dbfile,"./dummy2");
      uVar14 = 5;
      do {
        if (uVar14 == 10) {
          fdb_close(dbfile);
          iVar8 = local_430;
          for (lVar16 = 0; lVar16 != 10; lVar16 = lVar16 + 1) {
            fdb_doc_free(local_3c8[lVar16]);
          }
          fdb_shutdown();
          memleak_end();
          pcVar12 = "single kv instance";
          if ((char)iVar8 != '\0') {
            pcVar12 = "multiple kv instances";
          }
          sprintf(bodybuf,"Custom sequence number test %s",pcVar12);
          pcVar12 = "%s PASSED\n";
          if (custom_seqnum_test(bool)::__test_pass != '\0') {
            pcVar12 = "%s FAILED\n";
          }
          fprintf(_stderr,pcVar12,bodybuf);
          return;
        }
        sprintf(keybuf,"key%d",uVar14 & 0xffffffff);
        uVar15 = uVar11;
        while (-1 < (int)uVar15) {
          rdoc->seqnum = uVar14 * 2 + 2;
          fVar7 = fdb_get_byseq(apfStack_420[uVar15 + 1],rdoc);
          uVar15 = (ulong)((int)uVar15 - 1);
          if (fVar7 != FDB_RESULT_SUCCESS) {
            fprintf(_stderr,"Test failed: %s %d\n",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                    ,0xb7f);
            custom_seqnum_test(bool)::__test_pass = 1;
            __assert_fail("status == FDB_RESULT_SUCCESS",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                          ,0xb7f,"void custom_seqnum_test(bool)");
          }
        }
        uVar14 = uVar14 + 1;
      } while( true );
    }
    local_42c = (int)uVar14;
    fdb_iterator_init(apfStack_420[uVar14 + 1],&iterator,(void *)0x0,0,(void *)0x0,0,0);
    uVar14 = 2;
    uVar15 = 0;
    do {
      fVar7 = fdb_iterator_get(iterator,&rdoc);
      pfVar6 = rdoc;
      if (fVar7 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                ,0xb68);
        custom_seqnum_test(bool)::__test_pass = 1;
        __assert_fail("status == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                      ,0xb68,"void custom_seqnum_test(bool)");
      }
      pvVar3 = rdoc->key;
      pfVar4 = local_3c8[uVar15];
      pvVar5 = pfVar4->key;
      iVar8 = bcmp(pvVar3,pvVar5,rdoc->keylen);
      if (iVar8 != 0) {
        fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",pvVar5,pvVar3,
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                ,0xb69);
        custom_seqnum_test(bool)::__test_pass = 1;
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                      ,0xb69,"void custom_seqnum_test(bool)");
      }
      pvVar3 = pfVar6->body;
      pvVar5 = pfVar4->body;
      iVar8 = bcmp(pvVar3,pvVar5,pfVar6->bodylen);
      if (iVar8 != 0) {
        fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",pvVar5,pvVar3,
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                ,0xb6a);
        custom_seqnum_test(bool)::__test_pass = 1;
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                      ,0xb6a,"void custom_seqnum_test(bool)");
      }
      uVar1 = uVar15 + 1;
      if (uVar15 < 5) {
        if (uVar1 != pfVar6->seqnum) {
          fprintf(_stderr,"Test failed: %s %d\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                 );
          custom_seqnum_test(bool)::__test_pass = '\x01';
          if (uVar1 != rdoc->seqnum) {
            __assert_fail("rdoc->seqnum == (fdb_seqnum_t)i",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                          ,0xb6d,"void custom_seqnum_test(bool)");
          }
        }
      }
      else if (uVar14 != pfVar6->seqnum) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
               );
        custom_seqnum_test(bool)::__test_pass = '\x01';
        if (uVar14 != rdoc->seqnum) {
          __assert_fail("rdoc->seqnum == (fdb_seqnum_t)i*2",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                        ,0xb6f,"void custom_seqnum_test(bool)");
        }
      }
      fVar7 = fdb_iterator_next(iterator);
      uVar14 = uVar14 + 2;
      uVar15 = uVar1;
    } while (fVar7 != FDB_RESULT_ITERATOR_FAIL);
    fdb_iterator_close(iterator);
    fdb_commit(dbfile,'\x01');
    uVar14 = (ulong)(local_42c - 1);
  } while( true );
}

Assistant:

void custom_seqnum_test(bool multi_kv)
{
    TEST_INIT();

    memleak_start();

    int i, r;
    int n = 10;
    int num_kv = 4;
    fdb_file_handle *dbfile;
    fdb_kvs_handle **db = alca(fdb_kvs_handle*, num_kv);
    fdb_doc **doc = alca(fdb_doc*, n);
    fdb_doc real_doc;
    fdb_doc *rdoc = &real_doc;
    fdb_status status;
    fdb_iterator *iterator;

    char keybuf[256], bodybuf[256];
    memset(&real_doc, 0, sizeof(fdb_doc));
    real_doc.key = &keybuf;
    real_doc.body = &bodybuf;

    // remove previous dummy files
    r = system(SHELL_DEL" dummy* > errorlog.txt");
    (void)r;

    fdb_config fconfig = fdb_get_default_config();
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();

    fconfig.buffercache_size = 0;
    fconfig.wal_threshold = 1024;
    fconfig.flags = FDB_OPEN_FLAG_CREATE;
    fconfig.seqtree_opt = FDB_SEQTREE_USE; // enable seqtree since get_byseq
    fconfig.compaction_threshold = 0;
    fconfig.multi_kv_instances = multi_kv;
    r = 0;

    fdb_open(&dbfile, "./dummy1", &fconfig);
    if (multi_kv) {
        num_kv = 4;
        for (r = num_kv - 1; r >= 0; --r) {
            char tmp[16];
            sprintf(tmp, "kv%d", r);
            status = fdb_kvs_open(dbfile, &db[r], tmp, &kvs_config);
            TEST_CHK(status == FDB_RESULT_SUCCESS);
            status = fdb_set_log_callback(db[r], logCallbackFunc,
                                          (void *) "custom_seqnum_test");
            TEST_CHK(status == FDB_RESULT_SUCCESS);
        }
    } else {
        num_kv = 1;
        status = fdb_kvs_open_default(dbfile, &db[r], &kvs_config);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        status = fdb_set_log_callback(db[r], logCallbackFunc,
                (void *) "custom_seqnum_test");
        TEST_CHK(status == FDB_RESULT_SUCCESS);
    }

    for (i = 0; i < n/2; ++i){
        sprintf(keybuf, "key%d", i);
        sprintf(bodybuf, "body%d", i);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf) + 1, NULL, 0,
            (void*)bodybuf, strlen(bodybuf)+1);
        for (r = num_kv - 1; r >= 0; --r) {
            status = fdb_set(db[r], doc[i]);
            TEST_CHK(status == FDB_RESULT_SUCCESS);
        }
    }

    for (i = n/2; i < n; ++i){
        sprintf(keybuf, "key%d", i);
        sprintf(bodybuf, "body%d", i);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf) + 1, NULL, 0,
            (void*)bodybuf, strlen(bodybuf)+1);
        for (r = num_kv - 1; r >= 0; --r) {
            fdb_doc_set_seqnum(doc[i], (i+1)*2); // double seqnum instead of ++
            status = fdb_set(db[r], doc[i]);
            TEST_CHK(status == FDB_RESULT_SUCCESS);
        }
    }

    for (r = num_kv - 1; r >= 0; --r) {
        // range scan (before flushing WAL)
        fdb_iterator_init(db[r], &iterator, NULL, 0, NULL, 0, 0x0);
        i = 0;
        do {
            status = fdb_iterator_get(iterator, &rdoc);
            TEST_CHK(status == FDB_RESULT_SUCCESS);
            TEST_CMP(rdoc->key, doc[i]->key, rdoc->keylen);
            TEST_CMP(rdoc->body, doc[i]->body, rdoc->bodylen);
            ++i;
            if (i <= n/2) {
                TEST_CHK(rdoc->seqnum == (fdb_seqnum_t)i);
            } else {
                TEST_CHK(rdoc->seqnum == (fdb_seqnum_t)i*2);
            }
        } while(fdb_iterator_next(iterator) != FDB_RESULT_ITERATOR_FAIL);
        fdb_iterator_close(iterator);

        fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);
    }

    // do compaction
    fdb_compact(dbfile, (char *) "./dummy2");

    for (i = n/2; i < n; ++i){
        sprintf(keybuf, "key%d", i);
        for (r = num_kv - 1; r >= 0; --r) {
            rdoc->seqnum = (i + 1)*2;
            status = fdb_get_byseq(db[r], rdoc);
            TEST_CHK(status == FDB_RESULT_SUCCESS);
        }
    }

    fdb_close(dbfile);

    // free all documents
    for (i=0;i<n;++i){
        fdb_doc_free(doc[i]);
    }

    // free all resources
    fdb_shutdown();

    memleak_end();

    sprintf(bodybuf,"Custom sequence number test %s", multi_kv ?
            "multiple kv instances" : "single kv instance");
    TEST_RESULT(bodybuf);
}